

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_mul_ivec2(ShaderEvalContext *c)

{
  VecAccess<float,_4,_2> local_50;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  tcu local_20 [8];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)c + 0x30,3);
  tcu::Vector<float,_2>::asInt((Vector<float,_2> *)(local_30 + 8));
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)local_10 + 0x40,1);
  tcu::Vector<float,_2>::asInt((Vector<float,_2> *)(local_40 + 8));
  tcu::mul<int,2>(local_20,(Vector<int,_2> *)(local_30 + 8),(Vector<int,_2> *)(local_40 + 8));
  tcu::Vector<int,_2>::asFloat((Vector<int,_2> *)&local_18);
  local_50 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_50,&local_18);
  return;
}

Assistant:

void eval_selection_int		(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(int)c.in[1].x(),						(int)c.in[2].y()); }